

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5b9800::GoldenFrameIntervalTestLarge::~GoldenFrameIntervalTestLarge
          (GoldenFrameIntervalTestLarge *this)

{
  pointer pcVar1;
  
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_0103d9f8;
  pcVar1 = (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_EncoderTest).stats_.buffer_.field_2) {
    operator_delete(pcVar1);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~GoldenFrameIntervalTestLarge() override = default;